

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_count_scanner.cpp
# Opt level: O2

ColumnCountResult * __thiscall duckdb::ColumnCountScanner::ParseChunk(ColumnCountScanner *this)

{
  CSVBufferHandle *pCVar1;
  
  (this->result).result_position = 0;
  this->column_count = 1;
  if ((this->super_BaseScanner).cur_buffer_handle.internal.
      super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pCVar1 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                       (&(this->super_BaseScanner).cur_buffer_handle);
    (this->result).current_buffer_size = pCVar1->actual_size;
  }
  BaseScanner::ParseChunkInternal<duckdb::ColumnCountResult>(&this->super_BaseScanner,&this->result)
  ;
  return &this->result;
}

Assistant:

ColumnCountResult &ColumnCountScanner::ParseChunk() {
	result.result_position = 0;
	column_count = 1;
	if (cur_buffer_handle) {
		result.current_buffer_size = cur_buffer_handle->actual_size;
	}
	ParseChunkInternal(result);
	return result;
}